

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.h
# Opt level: O2

cmCommand * __thiscall cmTargetCompileFeaturesCommand::Clone(cmTargetCompileFeaturesCommand *this)

{
  cmCommand *this_00;
  
  this_00 = (cmCommand *)operator_new(0x58);
  cmTargetCompileFeaturesCommand((cmTargetCompileFeaturesCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmTargetCompileFeaturesCommand; }